

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleJitProfilingHelpers.cpp
# Opt level: O2

LoopEntryPointInfo * Js::SimpleJitHelpers::GetScheduledEntryPoint(void *framePtr,uint loopnum)

{
  bool bVar1;
  JavascriptCallStackLayout *pJVar2;
  FunctionBody *this;
  LoopHeader *this_00;
  LoopEntryPointInfo *this_01;
  LoopEntryPointInfo *pLVar3;
  
  pJVar2 = JavascriptCallStackLayout::FromFramePointer(framePtr);
  this = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)pJVar2);
  this_00 = FunctionBody::GetLoopHeader(this,loopnum);
  this_01 = LoopHeader::GetCurrentEntryPointInfo(this_00);
  bVar1 = EntryPointInfo::IsNotScheduled(&this_01->super_EntryPointInfo);
  pLVar3 = (LoopEntryPointInfo *)0x0;
  if (!bVar1) {
    pLVar3 = this_01;
  }
  return pLVar3;
}

Assistant:

LoopEntryPointInfo* SimpleJitHelpers::GetScheduledEntryPoint(void* framePtr, uint loopnum)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(SimpleGetScheduledEntryPoint);
        auto layout = JavascriptCallStackLayout::FromFramePointer(framePtr);
        FunctionBody* functionBody = layout->functionObject->GetFunctionBody();

        //REVIEW: Simplejit: Optimization: Don't emit this call if this is true during JIT time

        auto loopHeader = functionBody->GetLoopHeader(loopnum);
        LoopEntryPointInfo * entryPointInfo = loopHeader->GetCurrentEntryPointInfo();

        if (entryPointInfo->IsNotScheduled())
        {
            // Not scheduled yet! It will be impossible for this loop to be scheduled for a JIT unless we're the ones doing it,
            //   so there's no need to check whether the existing job is finished.
            return nullptr;
        }

        // The entry point has been scheduled, it is finished, or something else. Just return the entry point and the
        //   SimpleJitted function will check this on each iteration.
        return entryPointInfo;
        JIT_HELPER_END(SimpleGetScheduledEntryPoint);
    }